

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O0

string * __thiscall
deqp::gles3::Functional::FboConfig::getName_abi_cxx11_
          (string *__return_storage_ptr__,FboConfig *this)

{
  char *pcVar1;
  ostream *poVar2;
  undefined1 local_190 [8];
  ostringstream name;
  FboConfig *this_local;
  
  name._368_8_ = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  pcVar1 = getTypeName(this->colorType);
  poVar2 = std::operator<<((ostream *)local_190,pcVar1);
  poVar2 = std::operator<<(poVar2,"_");
  pcVar1 = FboTestUtil::getFormatName(this->colorFormat);
  std::operator<<(poVar2,pcVar1);
  if ((this->buffers & 0x100) != 0) {
    std::operator<<((ostream *)local_190,"_depth");
  }
  if ((this->buffers & 0x400) != 0) {
    std::operator<<((ostream *)local_190,"_stencil");
  }
  if ((this->buffers & 0x500) != 0) {
    poVar2 = std::operator<<((ostream *)local_190,"_");
    pcVar1 = getTypeName(this->depthStencilType);
    poVar2 = std::operator<<(poVar2,pcVar1);
    poVar2 = std::operator<<(poVar2,"_");
    pcVar1 = FboTestUtil::getFormatName(this->depthStencilFormat);
    std::operator<<(poVar2,pcVar1);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string FboConfig::getName (void) const
{
	std::ostringstream name;

	DE_ASSERT(buffers & GL_COLOR_BUFFER_BIT);
	name << getTypeName(colorType) << "_" << getFormatName(colorFormat);

	if (buffers & GL_DEPTH_BUFFER_BIT)
		name << "_depth";
	if (buffers & GL_STENCIL_BUFFER_BIT)
		name << "_stencil";

	if (buffers & (GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT))
		name << "_" << getTypeName(depthStencilType) << "_" << getFormatName(depthStencilFormat);

	return name.str();
}